

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall OpenMD::TimeCorrFunc<double>::doCorrelate(TimeCorrFunc<double> *this)

{
  long *in_RDI;
  
  painCave.isFatal = 0;
  painCave.severity = 3;
  snprintf(painCave.errMsg,2000,"Starting pre-correlate scan.");
  simError();
  (**(code **)(*in_RDI + 0x18))();
  snprintf(painCave.errMsg,2000,"Calculating correlation function.");
  simError();
  (**(code **)(*in_RDI + 0x20))();
  snprintf(painCave.errMsg,2000,"Doing post-correlation calculations.");
  simError();
  (**(code **)(*in_RDI + 0x28))();
  snprintf(painCave.errMsg,2000,"Writing output.");
  simError();
  (**(code **)(*in_RDI + 0x48))();
  return;
}

Assistant:

void TimeCorrFunc<T>::doCorrelate() {
    painCave.isFatal  = 0;
    painCave.severity = OPENMD_INFO;
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Starting pre-correlate scan.");
    simError();
    preCorrelate();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Calculating correlation function.");
    simError();
    correlation();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Doing post-correlation calculations.");
    simError();
    postCorrelate();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "Writing output.");
    simError();
    writeCorrelate();
  }